

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesToArray
          (MessageGenerator *this,Printer *printer)

{
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x58) == '\x01') {
    io::Printer::Print(printer,
                       "::google::protobuf::uint8* $classname$::SerializeWithCachedSizesToArray(\n    ::google::protobuf::uint8* target) const {\n  target =\n      _extensions_.SerializeMessageSetWithCachedSizesToArray(target);\n"
                       ,"classname",&this->classname_);
    if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
      io::Printer::Print(printer,
                         "  target = ::google::protobuf::internal::WireFormat::\n             SerializeUnknownMessageSetItemsToArray(\n               unknown_fields(), target);\n"
                        );
    }
  }
  else {
    io::Printer::Print(printer,
                       "::google::protobuf::uint8* $classname$::SerializeWithCachedSizesToArray(\n    ::google::protobuf::uint8* target) const {\n"
                       ,"classname",&this->classname_);
    io::Printer::Indent(printer);
    GenerateSerializeWithCachedSizesBody(this,printer,true);
    io::Printer::Outdent(printer);
  }
  io::Printer::Print(printer,"  return target;\n}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateSerializeWithCachedSizesToArray(io::Printer* printer) {
  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    printer->Print(
      "::google::protobuf::uint8* $classname$::SerializeWithCachedSizesToArray(\n"
      "    ::google::protobuf::uint8* target) const {\n"
      "  target =\n"
      "      _extensions_.SerializeMessageSetWithCachedSizesToArray(target);\n",
      "classname", classname_);
    if (HasUnknownFields(descriptor_->file())) {
      printer->Print(
        "  target = ::google::protobuf::internal::WireFormat::\n"
        "             SerializeUnknownMessageSetItemsToArray(\n"
        "               unknown_fields(), target);\n");
    }
    printer->Print(
      "  return target;\n"
      "}\n");
    return;
  }

  printer->Print(
    "::google::protobuf::uint8* $classname$::SerializeWithCachedSizesToArray(\n"
    "    ::google::protobuf::uint8* target) const {\n",
    "classname", classname_);
  printer->Indent();

  GenerateSerializeWithCachedSizesBody(printer, true);

  printer->Outdent();
  printer->Print(
    "  return target;\n"
    "}\n");
}